

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool BeginRead3dmLEGACYSTUFF(ON_BinaryArchive *file,uint stuff_tcode)

{
  bool bVar1;
  ON__INT64 local_28;
  ON__INT64 big_value;
  byte local_15;
  ON__UINT32 tcode;
  bool rc;
  ON_BinaryArchive *pOStack_10;
  uint stuff_tcode_local;
  ON_BinaryArchive *file_local;
  
  local_15 = 0;
  big_value._4_4_ = (uint)((stuff_tcode != 0 ^ 0xffU) & 1);
  local_28 = 0;
  tcode = stuff_tcode;
  pOStack_10 = file;
  do {
    bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk
                      (pOStack_10,(uint *)((long)&big_value + 4),&local_28);
    if (!bVar1) break;
    if (big_value._4_4_ == tcode) {
      local_15 = 1;
      break;
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_10);
  } while (bVar1);
  return (bool)(local_15 & 1);
}

Assistant:

static bool BeginRead3dmLEGACYSTUFF( ON_BinaryArchive& file, unsigned int stuff_tcode )
{
  // begins reading stuff chunk
  bool rc = false;
  ON__UINT32 tcode = !stuff_tcode;
  ON__INT64 big_value = 0;
  for (;;) 
  {
    if ( !file.BeginRead3dmBigChunk(&tcode,&big_value) )
      break;
    if ( tcode == stuff_tcode ) {
      rc = true;
      break;
    }
    if ( !file.EndRead3dmChunk() )
      break;
  }
  return rc;
}